

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

UniValue * AddrmanEntryToJSON(AddrInfo *info,CConnman *connman)

{
  UniValue *this;
  long in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *ret;
  uint32_t source_mapped_as;
  uint32_t mapped_as;
  UniValue *in_stack_fffffffffffffa18;
  CNetAddr *in_stack_fffffffffffffa20;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> in_stack_fffffffffffffa28
  ;
  undefined4 in_stack_fffffffffffffa30;
  VType in_stack_fffffffffffffa34;
  UniValue *in_stack_fffffffffffffa38;
  UniValue *in_stack_fffffffffffffa50;
  UniValue *val;
  UniValue *in_stack_fffffffffffffa58;
  UniValue *in_stack_fffffffffffffa60;
  UniValue *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Network net;
  allocator<char> local_519;
  uint32_t local_518;
  allocator<char> local_513;
  allocator<char> local_512;
  undefined1 local_511 [24];
  undefined1 local_4f9 [12];
  undefined1 local_4ed [4];
  allocator<char> local_4e9;
  uint32_t local_4e8;
  allocator<char> local_4e1 [1241];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  UniValue::UniValue(in_stack_fffffffffffffa38,in_stack_fffffffffffffa34,
                     (string *)in_stack_fffffffffffffa28.__d.__r);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa68,(char *)in_stack_fffffffffffffa60,
             (allocator<char> *)in_stack_fffffffffffffa58);
  CNetAddr::ToStringAddr_abi_cxx11_((CNetAddr *)in_stack_fffffffffffffa60);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffa58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa50);
  UniValue::pushKV(in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
                   in_stack_fffffffffffffa50);
  UniValue::~UniValue(in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::allocator<char>::~allocator(local_4e1);
  local_4e8 = CConnman::GetMappedAS
                        ((CConnman *)in_stack_fffffffffffffa28.__d.__r,in_stack_fffffffffffffa20);
  if (local_4e8 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa68,(char *)in_stack_fffffffffffffa60,
               (allocator<char> *)in_stack_fffffffffffffa58);
    UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>
              (in_stack_fffffffffffffa58,&in_stack_fffffffffffffa50->typ);
    UniValue::pushKV(in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
                     in_stack_fffffffffffffa50);
    UniValue::~UniValue(in_stack_fffffffffffffa18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa18);
    std::allocator<char>::~allocator(&local_4e9);
  }
  net = (Network)((ulong)(local_4ed + 3) >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa68,(char *)in_stack_fffffffffffffa60,
             (allocator<char> *)in_stack_fffffffffffffa58);
  local_4ed._1_2_ = CService::GetPort((CService *)in_stack_fffffffffffffa18);
  UniValue::UniValue<unsigned_short,_unsigned_short,_true>
            (in_stack_fffffffffffffa58,(unsigned_short *)in_stack_fffffffffffffa50);
  UniValue::pushKV(in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
                   in_stack_fffffffffffffa50);
  UniValue::~UniValue(in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::allocator<char>::~allocator((allocator<char> *)(local_4ed + 3));
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4ed;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)in_stack_fffffffffffffa60,(allocator<char> *)in_stack_fffffffffffffa58)
  ;
  local_4f9._1_8_ = *(undefined8 *)(in_RSI + 0x30);
  UniValue::UniValue<unsigned_long,_unsigned_long,_true>
            (in_stack_fffffffffffffa58,(unsigned_long *)in_stack_fffffffffffffa50);
  UniValue::pushKV(in_stack_fffffffffffffa60,(string *)in_stack_fffffffffffffa58,
                   in_stack_fffffffffffffa50);
  UniValue::~UniValue(in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::allocator<char>::~allocator((allocator<char> *)local_4ed);
  this_00 = (UniValue *)local_4f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)this_00,(allocator<char> *)in_stack_fffffffffffffa58);
  local_511._1_8_ = *(undefined8 *)(in_RSI + 0x28);
  this = (UniValue *)
         TicksSinceEpoch<std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                   (in_stack_fffffffffffffa28);
  local_511._9_8_ = this;
  UniValue::UniValue<long,_long,_true>(this,(long *)in_stack_fffffffffffffa50);
  UniValue::pushKV(this_00,(string *)this,in_stack_fffffffffffffa50);
  UniValue::~UniValue(in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::allocator<char>::~allocator((allocator<char> *)local_4f9);
  val = (UniValue *)local_511;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)this_00,(allocator<char> *)this);
  CNetAddr::GetNetClass(in_stack_fffffffffffffa20);
  GetNetworkName_abi_cxx11_(net);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
  UniValue::pushKV(this_00,(string *)this,val);
  UniValue::~UniValue(in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::allocator<char>::~allocator((allocator<char> *)local_511);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)this_00,(allocator<char> *)this);
  CNetAddr::ToStringAddr_abi_cxx11_((CNetAddr *)this_00);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
  UniValue::pushKV(this_00,(string *)this,val);
  UniValue::~UniValue(in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::allocator<char>::~allocator(&local_512);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)this_00,(allocator<char> *)this);
  CNetAddr::GetNetClass(in_stack_fffffffffffffa20);
  GetNetworkName_abi_cxx11_(net);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
  UniValue::pushKV(this_00,(string *)this,val);
  UniValue::~UniValue(in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa18);
  std::allocator<char>::~allocator(&local_513);
  local_518 = CConnman::GetMappedAS
                        ((CConnman *)in_stack_fffffffffffffa28.__d.__r,in_stack_fffffffffffffa20);
  if (local_518 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)this_00,(allocator<char> *)this);
    UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>(this,&val->typ);
    UniValue::pushKV(this_00,(string *)this,val);
    UniValue::~UniValue(in_stack_fffffffffffffa18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa18);
    std::allocator<char>::~allocator(&local_519);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

UniValue AddrmanEntryToJSON(const AddrInfo& info, CConnman& connman)
{
    UniValue ret(UniValue::VOBJ);
    ret.pushKV("address", info.ToStringAddr());
    const auto mapped_as{connman.GetMappedAS(info)};
    if (mapped_as != 0) {
        ret.pushKV("mapped_as", mapped_as);
    }
    ret.pushKV("port", info.GetPort());
    ret.pushKV("services", (uint64_t)info.nServices);
    ret.pushKV("time", int64_t{TicksSinceEpoch<std::chrono::seconds>(info.nTime)});
    ret.pushKV("network", GetNetworkName(info.GetNetClass()));
    ret.pushKV("source", info.source.ToStringAddr());
    ret.pushKV("source_network", GetNetworkName(info.source.GetNetClass()));
    const auto source_mapped_as{connman.GetMappedAS(info.source)};
    if (source_mapped_as != 0) {
        ret.pushKV("source_mapped_as", source_mapped_as);
    }
    return ret;
}